

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

int arangodb::velocypack::Collection::remove(char *__filename)

{
  string_view attrName;
  bool bVar1;
  size_type sVar2;
  ValueLength VVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int __fd;
  char *in_RSI;
  __sv_type _Var4;
  string key;
  ObjectIterator it;
  Builder *b;
  Value *in_stack_fffffffffffffec8;
  Slice in_stack_fffffffffffffed0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffee0;
  undefined1 translate;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffee8;
  Builder *this;
  Slice in_stack_ffffffffffffff00;
  char *local_f8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff50;
  ObjectIterator local_98;
  undefined1 local_65;
  char *local_20;
  char *local_10;
  char *local_8;
  
  this = (Builder *)__filename;
  local_10 = in_RSI;
  local_8 = __filename;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if ((sVar2 < 4) ||
     (VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                        (in_stack_ffffffffffffff18), VVar3 < 0xb)) {
    local_65 = 0;
    Builder::Builder((Builder *)in_stack_ffffffffffffff00._start);
    Value::Value((Value *)in_stack_fffffffffffffee0._M_current,
                 (ValueType)((ulong)in_stack_fffffffffffffed8._M_current >> 0x38),
                 SUB81((ulong)in_stack_fffffffffffffed8._M_current >> 0x30,0));
    Builder::add((Builder *)in_stack_fffffffffffffed0._start,in_stack_fffffffffffffec8);
    ObjectIterator::ObjectIterator
              ((ObjectIterator *)in_stack_fffffffffffffed8._M_current,
               (Slice)in_stack_fffffffffffffee0._M_current,
               SUB81((ulong)in_stack_fffffffffffffed0._start >> 0x38,0));
    while( true ) {
      translate = (undefined1)((ulong)in_stack_fffffffffffffee0._M_current >> 0x38);
      __fd = (int)local_10;
      bVar1 = ObjectIterator::valid(&local_98);
      if (!bVar1) break;
      in_stack_fffffffffffffee0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ObjectIterator::key(in_stack_fffffffffffffee8._M_current,(bool)translate);
      SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
                (in_stack_ffffffffffffff50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffec8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed8 =
           std::
           find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                     (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                      in_stack_fffffffffffffed8._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffec8);
      local_f8 = &stack0xffffffffffffff18;
      bVar1 = __gnu_cxx::
              operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffed0._start,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffec8);
      if (bVar1) {
        _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffed0._start);
        in_stack_fffffffffffffed0 =
             ObjectIterator::value((ObjectIterator *)in_stack_fffffffffffffee8._M_current);
        local_f8 = (char *)_Var4._M_len;
        attrName._M_str = (char *)this;
        attrName._M_len = (size_t)in_stack_fffffffffffffee8._M_current;
        in_stack_ffffffffffffff00 = in_stack_fffffffffffffed0;
        Builder::add((Builder *)in_stack_fffffffffffffee0._M_current,attrName,
                     (Slice *)in_stack_fffffffffffffed8._M_current);
      }
      ObjectIterator::next((ObjectIterator *)in_stack_ffffffffffffff00._start);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed0._start);
      local_10 = local_f8;
    }
    Builder::close(this,__fd);
  }
  else {
    local_20 = local_10;
    makeSet(in_stack_ffffffffffffff28);
    remove((Collection *)this,local_20);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1233e6);
  }
  return (int)__filename;
}

Assistant:

Builder Collection::remove(Slice slice,
                           std::vector<std::string> const& keys) {
  // check if there are so many keys that we want to use the hash-based version
  // cut-off values are arbitrary...
  if (keys.size() >= 4 && slice.length() > 10) {
    return remove(slice, makeSet(keys));
  }

  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (std::find(keys.begin(), keys.end(), key) == keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}